

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O1

Layer * getLayerForScale(Generator *g,int scale)

{
  long lVar1;
  
  if (0x15 < g->mc) {
    return (Layer *)0x0;
  }
  if (scale < 0x10) {
    if (scale == 0) {
      lVar1 = 0x1418;
    }
    else if (scale == 1) {
      lVar1 = 0x1148;
    }
    else {
      if (scale != 4) {
        return (Layer *)0x0;
      }
      lVar1 = 0x1150;
    }
  }
  else if (scale == 0x10) {
    lVar1 = 0x1158;
  }
  else if (scale == 0x40) {
    lVar1 = 0x1160;
  }
  else {
    if (scale != 0x100) {
      return (Layer *)0x0;
    }
    lVar1 = 0x1168;
  }
  return *(Layer **)((long)&g->mc + lVar1);
}

Assistant:

const Layer *getLayerForScale(const Generator *g, int scale)
{
    if (g->mc > MC_1_17)
        return NULL;
    switch (scale)
    {
    case 0:   return g->entry;
    case 1:   return g->ls.entry_1;
    case 4:   return g->ls.entry_4;
    case 16:  return g->ls.entry_16;
    case 64:  return g->ls.entry_64;
    case 256: return g->ls.entry_256;
    default:
        return NULL;
    }
}